

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

int inv_weight(void)

{
  obj **ppoVar1;
  xchar xVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  obj *poVar7;
  
  iVar4 = 0;
  poVar7 = invent;
  if (invent != (obj *)0x0) {
    do {
      if (poVar7->oclass == '\f') {
        uVar3 = SUB168(SEXT816((long)poVar7->quan + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) +
                (long)poVar7->quan + 0x32;
        iVar4 = iVar4 + ((int)(uVar3 >> 6) - (int)((long)uVar3 >> 0x3f));
      }
      else if ((poVar7->otyp != 0x214) || (((youmonst.data)->mflags2 & 0x8000000) == 0)) {
        if ((poVar7 == uarm) &&
           (iVar5 = poVar7->owt - (uint)objects[0x77].oc_weight,
           (uint)objects[0x77].oc_weight <= poVar7->owt && iVar5 != 0)) {
          xVar2 = mon_skill_level(0x28,&youmonst);
          if ('\x01' < xVar2) {
            if (xVar2 == '\x03') {
              iVar5 = iVar5 / 2;
            }
            else if (xVar2 == '\x02') {
              iVar6 = iVar5 * 3 + 3;
              if (-1 < iVar5 * 3) {
                iVar6 = iVar5 * 3;
              }
              iVar5 = iVar6 >> 2;
            }
            else {
              iVar6 = iVar5 + 3;
              if (-1 < iVar5) {
                iVar6 = iVar5;
              }
              iVar5 = iVar6 >> 2;
            }
          }
          iVar4 = iVar4 + (uint)objects[0x77].oc_weight + iVar5;
        }
        else {
          iVar4 = iVar4 + poVar7->owt;
        }
      }
      ppoVar1 = &poVar7->nobj;
      poVar7 = *ppoVar1;
    } while (*ppoVar1 != (obj *)0x0);
  }
  wc = weight_cap();
  return iVar4 - wc;
}

Assistant:

int inv_weight(void)
{
	struct obj *otmp = invent;
	int wt = 0;

	while (otmp) {
	    if (otmp->oclass == COIN_CLASS) {
		wt += (int)(((long)otmp->quan + 50L) / 100L);
	    } else if (otmp->otyp != BOULDER || !throws_rocks(youmonst.data)) {
		if (otmp == uarm && otmp->owt > P_BODY_ARMOR_MIN_WEIGHT) {
		    /*
		     * Reduce weight of worn body armor based on skill and
		     * weight difference from leather armor:
		     *
		     *  - unskilled -> no reduction
		     *  - basic     -> 25% reduction
		     *  - skilled   -> 50% reduction
		     *  - expert    -> 75% reduction
		     *
		     * e.g. Wearing plate mail {450} at expert only weighs {225}.
		     */
		    int wt_diff = otmp->owt - P_BODY_ARMOR_MIN_WEIGHT;
		    int ba_skill = mon_skill_level(P_BODY_ARMOR, &youmonst);
		    wt += P_BODY_ARMOR_MIN_WEIGHT;
		    if (ba_skill <= P_UNSKILLED)
			wt += wt_diff;
		    else if (ba_skill == P_BASIC)
			wt += wt_diff * 3 / 4;
		    else if (ba_skill == P_SKILLED)
			wt += wt_diff / 2;
		    else if (ba_skill >= P_EXPERT)
			wt += wt_diff / 4;
		} else {
		    wt += otmp->owt;
		}
	    }
	    otmp = otmp->nobj;
	}
	wc = weight_cap();
	return wt - wc;
}